

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermOrderingDiagram.cpp
# Opt level: O3

ostream * Kernel::operator<<(ostream *out,Node *node)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,*(char **)(&DAT_00b3dcb0 + (long)(int)node->tag * 8),1);
  pcVar2 = "? ";
  if ((ulong)node->ready != 0) {
    pcVar2 = " ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,2 - (ulong)node->ready);
  if (node->tag != T_POLY) {
    if (node->tag == T_TERM) {
      poVar1 = operator<<(out,&(node->field_1).lhs);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = operator<<(poVar1,&(node->field_2).rhs);
      return poVar1;
    }
    poVar1 = std::ostream::_M_insert<void_const*>(out);
    return poVar1;
  }
  poVar1 = operator<<(out,(node->field_1).poly);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const TermOrderingDiagram::Node& node)
{
  using Tag = TermOrderingDiagram::Node::Tag;
  out << (Tag)node.tag << (node.ready?" ":"? ");
  switch (node.tag) {
    case Tag::T_DATA: return out << node.data;
    case Tag::T_POLY: return out << *node.poly;
    case Tag::T_TERM: return out << node.lhs << " " << node.rhs;
  }
  ASSERTION_VIOLATION;
}